

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * setupTextLayout(QTextLayout *layout)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  double *pdVar4;
  QTextEngine *extraout_RDX;
  undefined8 extraout_RDX_00;
  int in_ESI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  double dVar5;
  int i;
  qreal y;
  QTextLine line;
  qreal maxWidth;
  int local_5c;
  qreal local_58;
  QPointF local_48;
  double local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  double local_20;
  QTextLine local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::setCacheEnabled(SUB41(in_ESI,0));
  QTextLayout::beginLayout();
  do {
    local_18.index = QTextLayout::createLine();
    local_18.eng = extraout_RDX;
    bVar1 = QTextLine::isValid(&local_18);
  } while (bVar1);
  QTextLayout::endLayout();
  local_20 = 0.0;
  local_58 = 0.0;
  for (local_5c = 0; iVar2 = QTextLayout::lineCount(), local_5c < iVar2; local_5c = local_5c + 1) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    uVar3 = QTextLayout::lineAt(in_ESI);
    local_30 = (undefined1 *)CONCAT44(local_30._4_4_,uVar3);
    local_28 = (undefined1 *)extraout_RDX_00;
    local_38 = (double)QTextLine::naturalTextWidth();
    pdVar4 = qMax<double>(&local_20,&local_38);
    local_20 = *pdVar4;
    QPointF::QPointF(&local_48,0.0,local_58);
    QTextLine::setPosition((QPointF *)&local_30);
    dVar5 = (double)QTextLine::height();
    local_58 = dVar5 + local_58;
  }
  QRectF::QRectF(in_RDI,0.0,0.0,local_20,local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QRectF setupTextLayout(QTextLayout *layout)
{
    layout->setCacheEnabled(true);
    layout->beginLayout();
    while (layout->createLine().isValid())
        ;
    layout->endLayout();
    qreal maxWidth = 0;
    qreal y = 0;
    for (int i = 0; i < layout->lineCount(); ++i) {
        QTextLine line = layout->lineAt(i);
        maxWidth = qMax(maxWidth, line.naturalTextWidth());
        line.setPosition(QPointF(0, y));
        y += line.height();
    }
    return QRectF(0, 0, maxWidth, y);
}